

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O0

int pcp_add_server(pcp_ctx_t *ctx,sockaddr *pcp_server,uint8_t pcp_version)

{
  int res;
  uint8_t pcp_version_local;
  sockaddr *pcp_server_local;
  pcp_ctx_t *ctx_local;
  
  if (ctx == (pcp_ctx_t *)0x0) {
    ctx_local._4_4_ = PCP_ERR_BAD_ARGS;
  }
  else if (pcp_version < 3) {
    ctx_local._4_4_ = psd_add_pcp_server(ctx,pcp_server,pcp_version);
  }
  else {
    ctx_local._4_4_ = PCP_ERR_UNSUP_VERSION;
  }
  return ctx_local._4_4_;
}

Assistant:

int pcp_add_server(pcp_ctx_t *ctx, struct sockaddr *pcp_server,
                   uint8_t pcp_version) {
    int res;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (!ctx) {
        return PCP_ERR_BAD_ARGS;
    }
    if (pcp_version > PCP_MAX_SUPPORTED_VERSION) {
        PCP_LOG_END(PCP_LOGLVL_INFO);
        return PCP_ERR_UNSUP_VERSION;
    }

    res = psd_add_pcp_server(ctx, pcp_server, pcp_version);

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return res;
}